

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O2

Vec_Int_t *
Wlc_NtkGetCoreSels(Gia_Man_t *pFrames,int nFrames,int first_sel_pi,int num_sel_pis,Vec_Bit_t *vMark,
                  int nConfLimit,Wlc_Par_t *pPars,int fSetPO,int RunId)

{
  uint nCap;
  int *piVar1;
  int iVar2;
  int iVar3;
  Aig_Man_t *pAig;
  Cnf_Dat_t *pCVar4;
  sat_solver *psVar5;
  Vec_Int_t *pVVar6;
  void *pvVar7;
  Vec_Int_t *p;
  undefined4 in_register_0000000c;
  long lVar8;
  undefined4 in_register_00000034;
  char *format;
  sat_solver *psVar9;
  ulong uVar10;
  ulong uVar11;
  int Lit;
  sat_solver *local_50;
  Vec_Int_t *local_48;
  Vec_Bit_t *local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000034,nFrames);
  local_40 = (Vec_Bit_t *)CONCAT44(in_register_0000000c,num_sel_pis);
  pAig = Gia_ManToAigSimple(pFrames);
  pCVar4 = Cnf_Derive(pAig,pAig->nObjs[3]);
  psVar5 = sat_solver_new();
  sat_solver_setnvars(psVar5,pCVar4->nVars);
  if (-1 < (int)vMark) {
    psVar5->RunId = (int)vMark;
    psVar5->pFuncStop = Wla_CallBackToStop;
  }
  lVar8 = 0;
  while (lVar8 < pCVar4->nClauses) {
    iVar2 = sat_solver_addclause(psVar5,pCVar4->pClauses[lVar8],pCVar4->pClauses[lVar8 + 1]);
    lVar8 = lVar8 + 1;
    if (iVar2 == 0) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcAbs.c"
                    ,0xea,
                    "Vec_Int_t *Wlc_NtkGetCoreSels(Gia_Man_t *, int, int, int, Vec_Bit_t *, int, Wlc_Par_t *, int, int)"
                   );
    }
  }
  local_50 = psVar5;
  pVVar6 = Vec_IntAlloc(100);
  for (iVar2 = 0; iVar2 < pAig->vCos->nSize; iVar2 = iVar2 + 1) {
    pvVar7 = Vec_PtrEntry(pAig->vCos,iVar2);
    if (pCVar4->pVarNums[*(int *)((long)pvVar7 + 0x24)] < 0) {
      __assert_fail("pCnf->pVarNums[pObj->Id] >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcAbs.c"
                    ,0xf3,
                    "Vec_Int_t *Wlc_NtkGetCoreSels(Gia_Man_t *, int, int, int, Vec_Bit_t *, int, Wlc_Par_t *, int, int)"
                   );
    }
    Vec_IntPush(pVVar6,pCVar4->pVarNums[*(int *)((long)pvVar7 + 0x24)] * 2);
  }
  psVar5 = local_50;
  iVar2 = sat_solver_addclause(local_50,pVVar6->pArray,pVVar6->pArray + pVVar6->nSize);
  if (iVar2 == 0) {
    Abc_Print((int)psVar5,"UNSAT after adding PO clauses.\n");
  }
  Vec_IntFree(pVVar6);
  local_48 = Vec_IntAlloc(100);
  pVVar6 = Vec_IntStart(pCVar4->nVars);
  iVar2 = 0;
  if (first_sel_pi < 1) {
    first_sel_pi = iVar2;
  }
  for (; psVar5 = local_50, first_sel_pi != iVar2; iVar2 = iVar2 + 1) {
    piVar1 = pCVar4->pVarNums;
    pvVar7 = Vec_PtrEntry(pAig->vCis,(int)local_38 + iVar2);
    iVar3 = piVar1[*(int *)((long)pvVar7 + 0x24)];
    if (iVar3 < 0) {
      __assert_fail("var >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcAbs.c"
                    ,0x118,
                    "Vec_Int_t *Wlc_NtkGetCoreSels(Gia_Man_t *, int, int, int, Vec_Bit_t *, int, Wlc_Par_t *, int, int)"
                   );
    }
    Vec_IntWriteEntry(pVVar6,iVar3,iVar2);
    Lit = iVar3 * 2;
    iVar3 = Vec_BitEntry(local_40,iVar2);
    if (iVar3 == 0) {
      sat_solver_addclause(local_50,&Lit,(lit *)&local_50);
    }
    else {
      Vec_IntPush(local_48,Lit);
    }
  }
  psVar9 = local_50;
  iVar2 = sat_solver_solve(local_50,local_48->pArray,local_48->pArray + local_48->nSize,0,0,0,0);
  if (iVar2 == 1) {
    format = "SAT.\n";
  }
  else {
    if (iVar2 == -1) {
      uVar11 = 0;
      Abc_Print((int)psVar9,"UNSAT.\n");
      piVar1 = (psVar5->conf_final).ptr;
      nCap = (psVar5->conf_final).size;
      p = Vec_IntAlloc(nCap);
      uVar10 = (ulong)nCap;
      if ((int)nCap < 1) {
        uVar10 = uVar11;
      }
      for (; uVar10 != uVar11; uVar11 = uVar11 + 1) {
        iVar2 = Vec_IntEntry(pVVar6,piVar1[uVar11] >> 1);
        Vec_IntPush(p,iVar2);
      }
      goto LAB_006e4423;
    }
    format = "UNKNOWN.\n";
  }
  p = (Vec_Int_t *)0x0;
  Abc_Print((int)psVar9,format);
LAB_006e4423:
  Vec_IntFree(local_48);
  Vec_IntFree(pVVar6);
  Cnf_ManFree();
  sat_solver_delete(local_50);
  Aig_ManStop(pAig);
  return p;
}

Assistant:

static Vec_Int_t * Wlc_NtkGetCoreSels( Gia_Man_t * pFrames, int nFrames, int first_sel_pi, int num_sel_pis, Vec_Bit_t * vMark, int nConfLimit, Wlc_Par_t * pPars, int fSetPO, int RunId ) 
{
    Vec_Int_t * vCores = NULL;
    Aig_Man_t * pAigFrames = Gia_ManToAigSimple( pFrames );
    Cnf_Dat_t * pCnf = Cnf_Derive(pAigFrames, Aig_ManCoNum(pAigFrames));
    sat_solver * pSat = sat_solver_new();
    int i;

    sat_solver_setnvars(pSat, pCnf->nVars);
    if ( RunId >= 0 )
    {
        sat_solver_set_runid( pSat, RunId );
        sat_solver_set_stop_func( pSat, Wla_CallBackToStop );
    }

    for (i = 0; i < pCnf->nClauses; i++) 
    {
        if (!sat_solver_addclause(pSat, pCnf->pClauses[i], pCnf->pClauses[i + 1]))
            assert(false);
    }
    // add PO clauses
    {
        Vec_Int_t* vLits = Vec_IntAlloc(100);
        Aig_Obj_t* pObj;
        int i, ret;
        Aig_ManForEachCo( pAigFrames, pObj, i )
        {
            assert(pCnf->pVarNums[pObj->Id] >= 0);
            Vec_IntPush(vLits, toLitCond(pCnf->pVarNums[pObj->Id], 0));
        }
        if ( !fSetPO )
        {
            ret = sat_solver_addclause(pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits));
            if (!ret) 
                Abc_Print( 1, "UNSAT after adding PO clauses.\n" );
        }
        else
        {
            int Lit;
            for ( i = 0; i < Vec_IntSize(vLits); ++i )
            {
                if ( i == Vec_IntSize(vLits) - 1 )
                    Lit = Vec_IntEntry( vLits, i );
                else
                    Lit = lit_neg(Vec_IntEntry( vLits, i ));
                ret = sat_solver_addclause(pSat, &Lit, &Lit + 1);
                if (!ret) 
                    Abc_Print( 1, "UNSAT after adding PO clauses.\n" );
            }
        }

        Vec_IntFree(vLits);
    }
    
    // main procedure
    {
        int status;
        Vec_Int_t* vLits = Vec_IntAlloc(100);
        Vec_Int_t* vMapVar2Sel = Vec_IntStart( pCnf->nVars );
        for ( i = 0; i < num_sel_pis; ++i ) 
        {
            int cur_pi = first_sel_pi + i;
            int var = pCnf->pVarNums[Aig_ManCi(pAigFrames, cur_pi)->Id];
            int Lit;
            assert(var >= 0);
            Vec_IntWriteEntry( vMapVar2Sel, var, i );
            Lit = toLitCond( var, 0 );
            if ( Vec_BitEntry( vMark, i ) )
                Vec_IntPush(vLits, Lit);
            else
                sat_solver_addclause( pSat, &Lit, &Lit+1 );
        }
        /*
            int i, Entry;
            Abc_Print( 1, "#vLits = %d; vLits = ", Vec_IntSize(vLits) );
            Vec_IntForEachEntry(vLits, Entry, i)
                Abc_Print( 1, "%d ", Entry);
            Abc_Print( 1, "\n");
        */
        status = sat_solver_solve(pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), (ABC_INT64_T)(nConfLimit), (ABC_INT64_T)(0), (ABC_INT64_T)(0), (ABC_INT64_T)(0));
        if (status == l_False) {
            int nCoreLits, *pCoreLits;
            Abc_Print( 1, "UNSAT.\n" );
            nCoreLits = sat_solver_final(pSat, &pCoreLits);
            vCores = Vec_IntAlloc( nCoreLits );
            for (i = 0; i < nCoreLits; i++) 
            {
                Vec_IntPush( vCores, Vec_IntEntry( vMapVar2Sel, lit_var( pCoreLits[i] ) ) );
            }
        } else if (status == l_True) {
            Abc_Print( 1, "SAT.\n" );
        } else {
            Abc_Print( 1, "UNKNOWN.\n" );
        }

        Vec_IntFree(vLits);
        Vec_IntFree(vMapVar2Sel);
    }
    Cnf_ManFree();
    sat_solver_delete(pSat);
    Aig_ManStop(pAigFrames);

    return vCores;
}